

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::RemoveWatchOnly(LegacyScriptPubKeyMan *this,CScript *dest)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  CPubKey pubKey;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  WalletDatabase *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 in_stack_ffffffffffffff3b;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  CScript *in_stack_ffffffffffffff58;
  WalletBatch *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58,
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(bool)in_stack_ffffffffffffff3b);
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::erase
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
             (key_type *)in_stack_ffffffffffffff20);
  CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar2 = ExtractPubKey(in_stack_ffffffffffffff58,in_RDI);
  if (bVar2) {
    CPubKey::GetID((CPubKey *)(in_RDI[5].vch + 3));
    std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::erase((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             *)CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
            (key_type *)in_stack_ffffffffffffff20);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar2 = LegacyDataSPKM::HaveWatchOnly
                    ((LegacyDataSPKM *)
                     CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  if (!bVar2) {
    boost::signals2::
    signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
    ::operator()((signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
                  *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),false);
  }
  (**(code **)(**(long **)(in_RDI->vch + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
             in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  bVar2 = WalletBatch::EraseWatchOnly(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar3 = bVar2 ^ 0xff;
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bVar3 & 1) == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::RemoveWatchOnly(const CScript &dest)
{
    {
        LOCK(cs_KeyStore);
        setWatchOnly.erase(dest);
        CPubKey pubKey;
        if (ExtractPubKey(dest, pubKey)) {
            mapWatchKeys.erase(pubKey.GetID());
        }
        // Related CScripts are not removed; having superfluous scripts around is
        // harmless (see comment in ImplicitlyLearnRelatedKeyScripts).
    }

    if (!HaveWatchOnly())
        NotifyWatchonlyChanged(false);
    if (!WalletBatch(m_storage.GetDatabase()).EraseWatchOnly(dest))
        return false;

    return true;
}